

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.cpp
# Opt level: O3

vector_type * __thiscall
nanoNet::NeuralNetwork::predict
          (vector_type *__return_storage_ptr__,NeuralNetwork *this,vector_type *inputData)

{
  NeuralNetworkLayer *pNVar1;
  pointer pfVar2;
  pointer pfVar3;
  NeuralNetworkLayer *layer;
  NeuralNetworkLayer *this_00;
  vector_type local_38;
  
  std::vector<float,_std::allocator<float>_>::vector(__return_storage_ptr__,inputData);
  pNVar1 = (this->m_layers).
           super__Vector_base<nanoNet::NeuralNetworkLayer,_std::allocator<nanoNet::NeuralNetworkLayer>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->m_layers).
                 super__Vector_base<nanoNet::NeuralNetworkLayer,_std::allocator<nanoNet::NeuralNetworkLayer>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pNVar1; this_00 = this_00 + 1
      ) {
    NeuralNetworkLayer::predict(&local_38,this_00,__return_storage_ptr__);
    pfVar2 = (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pfVar3 = (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
    super__Vector_impl_data._M_start =
         local_38.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_start;
    (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
    super__Vector_impl_data._M_finish =
         local_38.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_38.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    local_38.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_38.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_38.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if ((pfVar2 != (pointer)0x0) &&
       (operator_delete(pfVar2,(long)pfVar3 - (long)pfVar2),
       local_38.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_start != (pointer)0x0)) {
      operator_delete(local_38.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_38.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_38.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

NeuralNetworkLayer::vector_type NeuralNetwork::predict(
    const NeuralNetworkLayer::vector_type& inputData) const
{
    NeuralNetworkLayer::vector_type result(inputData);

    for (auto& layer : m_layers)
        result = layer.predict(result);

    return result;
}